

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_content_filter.cpp
# Opt level: O0

void __thiscall
cppcms::http::content_limits::content_limits(content_limits *this,cached_settings *s)

{
  long *in_RSI;
  noncopyable *in_RDI;
  
  booster::noncopyable::noncopyable(in_RDI);
  *(long *)in_RDI = in_RSI[1] << 10;
  *(long *)(in_RDI + 8) = (long)(int)in_RSI[2];
  *(long *)(in_RDI + 0x10) = *in_RSI << 10;
  std::__cxx11::string::string((string *)(in_RDI + 0x18),(string *)(in_RSI + 3));
  booster::hold_ptr<cppcms::http::content_limits::_data>::hold_ptr
            ((hold_ptr<cppcms::http::content_limits::_data> *)(in_RDI + 0x38));
  return;
}

Assistant:

content_limits::content_limits(impl::cached_settings const &s)  :
	content_length_limit_(s.security.content_length_limit * 1024LL),
	file_in_memory_limit_(s.security.file_in_memory_limit),
	multipart_form_data_limit_(s.security.multipart_form_data_limit * 1024LL),
	uploads_path_(s.security.uploads_path)
{
}